

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

int __thiscall
adios2::Remote::LaunchRemoteServerViaConnectionManager(Remote *this,string *remoteHost)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  char *pcVar4;
  HostConfig *ho;
  _Base_ptr p_Var5;
  _Base_ptr __rhs;
  allocator local_97c;
  allocator local_97b;
  allocator local_97a;
  allocator local_979;
  char *value;
  NetworkSocket socket;
  int local_964;
  char *rest;
  string cookie;
  string request;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  string local_898;
  string local_878;
  string local_858;
  char response [2048];
  
  if (remoteHost->_M_string_length == 0) {
    return 0x6658;
  }
  bVar1 = std::operator==(remoteHost,"localhost");
  if (bVar1) {
    return 0x6658;
  }
  helper::NetworkSocket::NetworkSocket(&socket);
  std::__cxx11::string::string((string *)&local_858,"localhost",(allocator *)response);
  std::__cxx11::string::string((string *)&local_878,"tcp",(allocator *)&request);
  helper::NetworkSocket::Connect(&socket,&local_858,30000,&local_878);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_858);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
          ::find(&((this->m_HostOptions).
                   super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_M_t,remoteHost);
  if ((_Rb_tree_header *)iVar3._M_node !=
      &(((this->m_HostOptions).
         super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header) {
    __rhs = (_Base_ptr)0x0;
    for (p_Var5 = *(_Base_ptr *)(iVar3._M_node + 2); p_Var5 != iVar3._M_node[2]._M_parent;
        p_Var5 = (_Base_ptr)&p_Var5[6]._M_right) {
      if (p_Var5[1]._M_color == _S_black) {
        __rhs = p_Var5;
      }
    }
    if (__rhs != (_Base_ptr)0x0) goto LAB_005f5234;
  }
  std::__cxx11::string::string((string *)response,"Toolkit",(allocator *)&local_898);
  std::__cxx11::string::string((string *)&request,"Remote",(allocator *)&local_8b8);
  std::__cxx11::string::string((string *)&cookie,"EstablishConnection",(allocator *)&local_8d8);
  std::operator+(&local_918,"No ssh configuration found for host ",remoteHost);
  std::operator+(&local_8f8,&local_918,". Add config in ~/.config/adios2/hosts.yaml");
  helper::Throw<std::invalid_argument>((string *)response,&request,&cookie,&local_8f8,-1);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string((string *)&cookie);
  std::__cxx11::string::~string((string *)&request);
  std::__cxx11::string::~string((string *)response);
  __rhs = (_Base_ptr)0x0;
LAB_005f5234:
  std::operator+(&cookie,"/run_service?group=",remoteHost);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)response,
                 &cookie,"&service=");
  std::operator+(&request,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          response,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::__cxx11::string::~string((string *)response);
  std::__cxx11::string::~string((string *)&cookie);
  helper::NetworkSocket::RequestResponse(&socket,&request,response,0x800);
  cookie._M_dataplus._M_p = (pointer)&cookie.field_2;
  cookie._M_string_length = 0;
  cookie.field_2._M_local_buf[0] = '\0';
  local_964 = -1;
  rest = response;
LAB_005f52f1:
  while( true ) {
    pcVar4 = strtok_r(rest,",",&rest);
    if (pcVar4 == (char *)0x0) {
      helper::NetworkSocket::Close(&socket);
      std::__cxx11::string::~string((string *)&cookie);
      std::__cxx11::string::~string((string *)&request);
      helper::NetworkSocket::~NetworkSocket(&socket);
      return local_964;
    }
    value = pcVar4;
    pcVar4 = strtok_r(pcVar4,":",&value);
    iVar2 = strncmp(pcVar4,"port",4);
    if (iVar2 != 0) break;
    local_964 = atoi(value);
  }
  iVar2 = strncmp(pcVar4,"cookie",6);
  if (iVar2 != 0) {
    if (((*pcVar4 == 'm') && (pcVar4[1] == 's')) && (pcVar4[2] == 'g')) goto code_r0x005f537b;
    std::__cxx11::string::string((string *)&local_8f8,"Toolkit",&local_979);
    std::__cxx11::string::string((string *)&local_918,"Remote",&local_97a);
    std::__cxx11::string::string((string *)&local_898,"EstablishConnection",&local_97b);
    std::__cxx11::string::string((string *)&local_8d8,pcVar4,&local_97c);
    std::operator+(&local_8b8,"Invalid response from connection manager. Do not understand key ",
                   &local_8d8);
    helper::Throw<std::invalid_argument>(&local_8f8,&local_918,&local_898,&local_8b8,-1);
    goto LAB_005f5494;
  }
  std::__cxx11::string::string((string *)&local_8f8,value,(allocator *)&local_918);
  std::__cxx11::string::operator=((string *)&cookie,(string *)&local_8f8);
  goto LAB_005f54d3;
code_r0x005f537b:
  iVar2 = strcmp(value,"no_error");
  if (iVar2 != 0) {
    std::__cxx11::string::string((string *)&local_8f8,"Toolkit",&local_979);
    std::__cxx11::string::string((string *)&local_918,"Remote",&local_97a);
    std::__cxx11::string::string((string *)&local_898,"EstablishConnection",&local_97b);
    std::__cxx11::string::string((string *)&local_8d8,value,&local_97c);
    std::operator+(&local_8b8,"Error response from connection manager: ",&local_8d8);
    helper::Throw<std::invalid_argument>(&local_8f8,&local_918,&local_898,&local_8b8,-1);
LAB_005f5494:
    std::__cxx11::string::~string((string *)&local_8b8);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_918);
LAB_005f54d3:
    std::__cxx11::string::~string((string *)&local_8f8);
  }
  goto LAB_005f52f1;
}

Assistant:

int Remote::LaunchRemoteServerViaConnectionManager(const std::string remoteHost)
{
    if (remoteHost.empty() || remoteHost == "localhost")
    {
        // std::cout << "Remote::LaunchRemoteServerViaConnectionManager: Assume server is already "
        //              "running at on localhost at port = "
        //           << 26200 << std::endl;
        return 26200;
    }

    helper::NetworkSocket socket;
    socket.Connect("localhost", 30000);

    struct adios2::HostConfig *hostconf = nullptr;

    auto it = m_HostOptions->find(remoteHost);
    if (it != m_HostOptions->end())
    {
        for (auto &ho : it->second)
        {
            if (ho.protocol == HostAccessProtocol::SSH)
            {
                hostconf = &ho;
            }
        }
    }
    if (!hostconf)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "Remote", "EstablishConnection",
                                             "No ssh configuration found for host " + remoteHost +
                                                 ". Add config in ~/.config/adios2/hosts.yaml");
    }

    std::string request = "/run_service?group=" + remoteHost + "&service=" + hostconf->name;

    char response[2048];
    socket.RequestResponse(request, response, 2048);

    // responses:
    //   port:-1,msg:incomplete_service_definition
    //   port:-1,msg:missing_service_in_request
    //   port:26200,cookie:0xd93d91e3643c9869,msg:no_error

    char *token;
    char *rest = response;

    int serverPort = -1;
    std::string cookie;

    // std::cout << "Response = \"" << response << "\"" << std::endl;
    while ((token = strtok_r(rest, ",", &rest)))
    {
        char *key;
        char *value = token;
        key = strtok_r(value, ":", &value);
        if (!strncmp(key, "port", 4))
        {
            serverPort = atoi(value);
        }
        else if (!strncmp(key, "cookie", 6))
        {
            cookie = std::string(value);
        }
        else if (!strncmp(key, "msg", 3))
        {
            if (strcmp(value, "no_error"))
            {
                helper::Throw<std::invalid_argument>("Toolkit", "Remote", "EstablishConnection",
                                                     "Error response from connection manager: " +
                                                         std::string(value));
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "Remote", "EstablishConnection",
                "Invalid response from connection manager. Do not understand key " +
                    std::string(key));
        }
    }

    socket.Close();
    return serverPort;
}